

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O0

void __thiscall Spaghetti<TTA>::FirstScan(Spaghetti<TTA> *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  uint *puVar10;
  int iVar11;
  int local_b4;
  int c_3;
  uint *img_labels_row_prev_prev_1;
  uint *img_labels_row_3;
  uchar *img_row_prev_prev_1;
  uchar *img_row_prev_1;
  uchar *img_row_3;
  int r_1;
  int c_2;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_2;
  uchar *img_row_fol_1;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row_2;
  int r;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_fol;
  uchar *img_row_1;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  int w;
  int h;
  Spaghetti<TTA> *this_local;
  
  uVar7 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uVar1 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar7 & 0xfffffffe;
  this->o_rows = (int)uVar7 % 2 == 1;
  this->e_cols = uVar1 & 0xfffffffe;
  this->o_cols = (int)uVar1 % 2 == 1;
  TTA::Setup();
  if (uVar7 == 1) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,0);
    img_row_1._4_4_ = -2;
LAB_001afd84:
    iVar6 = img_row_1._4_4_ + 2;
    if (iVar6 < (int)(uVar1 - 2)) {
      if (puVar9[iVar6] == '\0') goto LAB_001afdff;
      if (puVar9[img_row_1._4_4_ + 3] == '\0') {
        uVar7 = TTA::NewLabel();
        puVar10[iVar6] = uVar7;
        img_row_1._4_4_ = iVar6;
      }
      else {
        uVar7 = TTA::NewLabel();
        puVar10[iVar6] = uVar7;
        img_row_1._4_4_ = iVar6;
        while( true ) {
          while( true ) {
            iVar6 = img_row_1._4_4_ + 2;
            if ((int)(uVar1 - 2) <= iVar6) {
              if ((int)(uVar1 - 2) < iVar6) {
                if (puVar9[iVar6] != '\0') {
                  puVar10[iVar6] = puVar10[img_row_1._4_4_];
                  return;
                }
                puVar10[iVar6] = 0;
                return;
              }
              if (puVar9[iVar6] != '\0') {
                if (puVar9[img_row_1._4_4_ + 3] != '\0') {
                  puVar10[iVar6] = puVar10[img_row_1._4_4_];
                  return;
                }
                puVar10[iVar6] = puVar10[img_row_1._4_4_];
                return;
              }
              goto LAB_001aff9c;
            }
            if (puVar9[iVar6] == '\0') break;
            if (puVar9[img_row_1._4_4_ + 3] == '\0') {
              puVar10[iVar6] = puVar10[img_row_1._4_4_];
              img_row_1._4_4_ = iVar6;
              goto LAB_001afd84;
            }
            puVar10[iVar6] = puVar10[img_row_1._4_4_];
            img_row_1._4_4_ = iVar6;
          }
LAB_001afdff:
          img_row_1._4_4_ = iVar6;
          if (puVar9[img_row_1._4_4_ + 1] == '\0') break;
          uVar7 = TTA::NewLabel();
          puVar10[img_row_1._4_4_] = uVar7;
        }
        puVar10[img_row_1._4_4_] = 0;
      }
      goto LAB_001afd84;
    }
    if ((int)(uVar1 - 2) < iVar6) {
      if (puVar9[iVar6] == '\0') {
        puVar10[iVar6] = 0;
      }
      else {
        uVar7 = TTA::NewLabel();
        puVar10[iVar6] = uVar7;
      }
    }
    else if (puVar9[iVar6] == '\0') {
LAB_001aff9c:
      img_row_1._4_4_ = iVar6;
      if (puVar9[img_row_1._4_4_ + 1] == '\0') {
        puVar10[img_row_1._4_4_] = 0;
      }
      else {
        uVar7 = TTA::NewLabel();
        puVar10[img_row_1._4_4_] = uVar7;
      }
    }
    else if (puVar9[img_row_1._4_4_ + 3] == '\0') {
      uVar7 = TTA::NewLabel();
      puVar10[iVar6] = uVar7;
    }
    else {
      uVar7 = TTA::NewLabel();
      puVar10[iVar6] = uVar7;
    }
  }
  else {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,0);
    img_row_2._4_4_ = -2;
LAB_001b008f:
    img_row_2._4_4_ = img_row_2._4_4_ + 2;
    iVar6 = img_row_2._4_4_;
    if (img_row_2._4_4_ < (int)(uVar1 - 2)) {
      if ((puVar9[img_row_2._4_4_] == '\0') && (puVar9[img_row_2._4_4_ + lVar2] == '\0'))
      goto LAB_001b0125;
LAB_001b00cc:
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        uVar8 = TTA::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
        goto LAB_001b0232;
      }
      uVar8 = TTA::NewLabel();
      puVar10[img_row_2._4_4_] = uVar8;
LAB_001b018d:
      do {
        iVar6 = img_row_2._4_4_ + 2;
        if ((int)(uVar1 - 2) <= iVar6) {
          if ((int)(uVar1 - 2) < iVar6) {
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar2] == '\0') {
                puVar10[iVar6] = 0;
              }
              else {
                puVar10[iVar6] = puVar10[img_row_2._4_4_];
              }
            }
            else {
              puVar10[iVar6] = puVar10[img_row_2._4_4_];
            }
          }
          else {
            img_row_2._4_4_ = iVar6;
            if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) goto LAB_001b0512;
LAB_001b0593:
            if (puVar9[img_row_2._4_4_ + 1] == '\0') {
              puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
            }
            else {
              puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
            }
          }
          goto LAB_001b0664;
        }
        img_row_2._4_4_ = iVar6;
        if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) {
LAB_001b0125:
          img_row_2._4_4_ = iVar6;
          if (puVar9[img_row_2._4_4_ + 1] == '\0') {
            if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
              puVar10[img_row_2._4_4_] = 0;
              goto LAB_001b008f;
            }
            uVar8 = TTA::NewLabel();
            puVar10[img_row_2._4_4_] = uVar8;
          }
          else {
            uVar8 = TTA::NewLabel();
            puVar10[img_row_2._4_4_] = uVar8;
          }
        }
        else {
          while (puVar9[img_row_2._4_4_ + 1] == '\0') {
            puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
LAB_001b0232:
            while( true ) {
              iVar6 = img_row_2._4_4_ + 2;
              if ((int)(uVar1 - 2) <= iVar6) {
                if ((int)(uVar1 - 2) < iVar6) {
                  if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) {
                    puVar10[iVar6] = 0;
                    goto LAB_001b0664;
                  }
                }
                else {
                  if (puVar9[iVar6] != '\0') {
                    iVar11 = img_row_2._4_4_ + 1;
                    img_row_2._4_4_ = iVar6;
                    if (puVar9[iVar11 + lVar2] == '\0') goto LAB_001b04bf;
                    goto LAB_001b0593;
                  }
                  if (puVar9[iVar6 + lVar2] == '\0') goto LAB_001b0512;
                }
                if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                  uVar8 = TTA::NewLabel();
                  puVar10[iVar6] = uVar8;
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_2._4_4_];
                }
                goto LAB_001b0664;
              }
              if (puVar9[iVar6] != '\0') break;
              if (puVar9[iVar6 + lVar2] == '\0') goto LAB_001b0125;
              if (puVar9[img_row_2._4_4_ + 3] != '\0') {
                if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                  uVar8 = TTA::NewLabel();
                  puVar10[iVar6] = uVar8;
                  img_row_2._4_4_ = iVar6;
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_2._4_4_];
                  img_row_2._4_4_ = iVar6;
                }
                goto LAB_001b018d;
              }
              if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                uVar8 = TTA::NewLabel();
                puVar10[iVar6] = uVar8;
                img_row_2._4_4_ = iVar6;
              }
              else {
                puVar10[iVar6] = puVar10[img_row_2._4_4_];
                img_row_2._4_4_ = iVar6;
              }
            }
            iVar11 = img_row_2._4_4_ + 1;
            img_row_2._4_4_ = iVar6;
            if (puVar9[iVar11 + lVar2] == '\0') goto LAB_001b00cc;
          }
          puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
        }
      } while( true );
    }
    if ((int)(uVar1 - 2) < img_row_2._4_4_) {
      if (puVar9[img_row_2._4_4_] == '\0') {
        if (puVar9[img_row_2._4_4_ + lVar2] == '\0') {
          puVar10[img_row_2._4_4_] = 0;
        }
        else {
          uVar8 = TTA::NewLabel();
          puVar10[img_row_2._4_4_] = uVar8;
        }
      }
      else {
        uVar8 = TTA::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
    else if ((puVar9[img_row_2._4_4_] == '\0') && (puVar9[img_row_2._4_4_ + lVar2] == '\0')) {
LAB_001b0512:
      img_row_2._4_4_ = iVar6;
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
          puVar10[img_row_2._4_4_] = 0;
        }
        else {
          uVar8 = TTA::NewLabel();
          puVar10[img_row_2._4_4_] = uVar8;
        }
      }
      else {
        uVar8 = TTA::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
    else {
LAB_001b04bf:
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        uVar8 = TTA::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
      else {
        uVar8 = TTA::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
LAB_001b0664:
    for (img_row_2._0_4_ = 2;
        (int)img_row_2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
        img_row_2._0_4_ = (int)img_row_2 + 2) {
      puVar9 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          (int)img_row_2);
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar2;
      lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      puVar10 = cv::Mat::ptr<unsigned_int>
                          (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                            super_Mat,(int)img_row_2);
      lVar5 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      iVar6 = 0;
      img_row_3._4_4_ = 0;
      if (0 < (int)(uVar1 - 2)) {
        if (*puVar9 == '\0') goto LAB_001b08f3;
LAB_001b0769:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001b07b6;
          if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
            uVar8 = TTA::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
            goto LAB_001b2386;
          }
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
          goto LAB_001b244d;
        }
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
LAB_001b287e:
        do {
          iVar6 = img_row_3._4_4_ + 2;
          if ((int)(uVar1 - 2) <= iVar6) {
            if ((int)(uVar1 - 2) < iVar6) {
              if (puVar9[iVar6] == '\0') {
                if (puVar9[iVar6 + lVar3] == '\0') {
                  puVar10[iVar6] = 0;
                }
                else {
LAB_001b342d:
                  if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                    if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                      uVar8 = TTA::NewLabel();
                      puVar10[iVar6] = uVar8;
                    }
                    else {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    }
                  }
                  else {
                    puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  }
                }
              }
              else if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
LAB_001b33cd:
                  if (puVar9[iVar6 - lVar2] == '\0') {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                  else {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                  }
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                }
              }
              else {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
              }
              goto LAB_001b4208;
            }
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b3603;
              if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001b342d;
              if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001b3c4d;
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b358a;
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                if (puVar9[iVar6 - lVar2] == '\0') {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                }
                goto LAB_001b4208;
              }
            }
            else {
              if ((puVar9[img_row_3._4_4_ + 1] == '\0') &&
                 (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0')) {
                if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') goto LAB_001b33cd;
                img_row_3._4_4_ = iVar6;
                if (puVar9[iVar6 - lVar2] == '\0') {
LAB_001b36d9:
                  if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                    uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                       *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5))
                    ;
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                }
                goto LAB_001b4208;
              }
LAB_001b3c4d:
              img_row_3._4_4_ = iVar6;
              iVar6 = img_row_3._4_4_;
              if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                goto LAB_001b4208;
              }
            }
LAB_001b3c69:
            img_row_3._4_4_ = iVar6;
            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
              if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                   puVar10[img_row_3._4_4_ + -2]);
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
            }
            else {
              puVar10[img_row_3._4_4_] =
                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            }
            goto LAB_001b4208;
          }
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b096b;
            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] != '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_001b1f3d;
              }
              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                uVar8 = TTA::NewLabel();
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_001b1f3d;
              }
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
              goto LAB_001b1f3d;
            }
            if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001b1e70;
            if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b091c;
            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_001b1e8c;
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') goto LAB_001b1d13;
            if (puVar9[iVar6 - lVar2] != '\0') {
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_001b160f;
            }
            puVar10[iVar6] = puVar10[img_row_3._4_4_];
            img_row_3._4_4_ = iVar6;
LAB_001b13b0:
            iVar6 = img_row_3._4_4_ + 2;
            if ((int)(uVar1 - 2) <= iVar6) {
              if ((int)(uVar1 - 2) < iVar6) {
LAB_001b3173:
                img_row_3._4_4_ = iVar6;
                if (puVar9[img_row_3._4_4_] == '\0') {
LAB_001b312f:
                  if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
                    puVar10[img_row_3._4_4_] = 0;
                  }
                  else {
                    puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                  }
                }
                else {
                  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                }
                goto LAB_001b4208;
              }
              if (puVar9[iVar6] == '\0') {
                if (puVar9[iVar6 + lVar3] == '\0') {
LAB_001b3a10:
                  img_row_3._4_4_ = iVar6;
                  if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_001b3620;
                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                    uVar8 = TTA::NewLabel();
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                  goto LAB_001b4208;
                }
                if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  goto LAB_001b4208;
                }
              }
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
              }
              else {
                uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                   puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
              }
              goto LAB_001b4208;
            }
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar3] == '\0') {
LAB_001b1576:
                img_row_3._4_4_ = iVar6;
                iVar6 = img_row_3._4_4_;
                if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_001b0985;
                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  goto LAB_001b1bf4;
                }
                if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
LAB_001b19a9:
                  iVar6 = img_row_3._4_4_ + 2;
                  if ((int)(uVar1 - 2) <= iVar6) {
                    if ((int)(uVar1 - 2) < iVar6) goto LAB_001b3173;
                    if (puVar9[iVar6] == '\0') {
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        iVar11 = img_row_3._4_4_ + 3;
                        img_row_3._4_4_ = iVar6;
                        if (puVar9[iVar11] == '\0') goto LAB_001b3620;
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        goto LAB_001b4208;
                      }
                      if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                        puVar10[iVar6] = puVar10[img_row_3._4_4_];
                        goto LAB_001b4208;
                      }
                    }
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    }
                    else {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                    }
                    goto LAB_001b4208;
                  }
                  if (puVar9[iVar6] == '\0') {
                    if (puVar9[iVar6 + lVar3] == '\0') {
                      if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001b0985;
                      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        img_row_3._4_4_ = iVar6;
                        goto LAB_001b1bf4;
                      }
                      iVar11 = img_row_3._4_4_ + 4;
                      img_row_3._4_4_ = iVar6;
                      if (puVar9[iVar11 - lVar2] == '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        goto LAB_001b160f;
                      }
LAB_001b07e3:
                      if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                        uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                    (long)img_row_3._4_4_ * 4 + lVar5),
                                           *(uint *)((long)puVar10 +
                                                    (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                        puVar10[img_row_3._4_4_] = uVar8;
                      }
                      else {
                        puVar10[img_row_3._4_4_] =
                             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                      }
                      goto LAB_001b19a9;
                    }
                    if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                      goto LAB_001b1f3d;
                    }
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                      img_row_3._4_4_ = iVar6;
                      goto LAB_001b1bf4;
                    }
                  }
                  else {
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                      img_row_3._4_4_ = iVar6;
                      goto LAB_001b287e;
                    }
                    if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                      goto LAB_001b2b8c;
                    }
                  }
                  if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
                    puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar6;
LAB_001b2039:
                    do {
                      iVar6 = img_row_3._4_4_ + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) goto LAB_001b3173;
                        if (puVar9[iVar6] == '\0') {
                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b3a10;
                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                            goto LAB_001b4208;
                          }
                        }
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                        }
                        else if (puVar9[iVar6 + lVar4] == '\0') {
                          uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                             puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                        }
                        else {
LAB_001b34ff:
                          img_row_3._4_4_ = iVar6;
                          iVar6 = img_row_3._4_4_;
                          if (puVar9[(img_row_3._4_4_ + -2) - lVar2] == '\0') {
                            uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                        (long)img_row_3._4_4_ * 4 + lVar5),
                                               puVar10[img_row_3._4_4_ + -2]);
                            puVar10[img_row_3._4_4_] = uVar8;
                          }
                          else {
LAB_001b32c5:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                              uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                          (long)img_row_3._4_4_ * 4 + lVar5),
                                                 puVar10[img_row_3._4_4_ + -2]);
                              puVar10[img_row_3._4_4_] = uVar8;
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          }
                        }
                        goto LAB_001b4208;
                      }
                      if (puVar9[iVar6] == '\0') {
                        if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b1576;
                        if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar6;
                          goto LAB_001b1f3d;
                        }
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                          if (puVar9[iVar6 + lVar4] == '\0') {
                            uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                               puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else {
                            if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_001b18ea;
                            uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                               puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
LAB_001b1bf4:
                          do {
                            iVar6 = img_row_3._4_4_ + 2;
                            if ((int)(uVar1 - 2) <= iVar6) {
                              if ((int)(uVar1 - 2) < iVar6) goto LAB_001b3173;
                              if (puVar9[iVar6] != '\0') goto LAB_001b3c4d;
                              if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b3603;
                              if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_001b3c4d;
                              puVar10[iVar6] = puVar10[img_row_3._4_4_];
                              goto LAB_001b4208;
                            }
                            if (puVar9[iVar6] != '\0') goto LAB_001b1c35;
                            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b096b;
                            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                              puVar10[iVar6] = puVar10[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar6;
LAB_001b1f3d:
                              iVar6 = img_row_3._4_4_ + 2;
                              if (iVar6 < (int)(uVar1 - 2)) {
                                if (puVar9[iVar6] != '\0') {
                                  iVar11 = img_row_3._4_4_ + 1;
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[iVar11 + lVar3] == '\0') goto LAB_001b0a02;
                                  goto LAB_001b0d4c;
                                }
LAB_001b1f9a:
                                img_row_3._4_4_ = iVar6;
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[img_row_3._4_4_ + lVar3] == '\0') goto LAB_001b096b;
                                if (puVar9[img_row_3._4_4_ + 1] != '\0') {
                                  if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0')
                                  goto LAB_001b091c;
LAB_001b1244:
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
LAB_001b128e:
                                    if (puVar9[(img_row_3._4_4_ + 2) - lVar2] == '\0') {
LAB_001b10fe:
                                      if (puVar9[img_row_3._4_4_ - lVar2] != '\0') {
                                        uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar5),
                                                           puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
LAB_001b160f:
                                        iVar6 = img_row_3._4_4_ + 2;
                                        if (iVar6 < (int)(uVar1 - 2)) {
                                          if (puVar9[iVar6] != '\0') {
                                            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0')
                                            goto LAB_001b1710;
                                            if (puVar9[iVar6 + lVar4] != '\0') goto LAB_001b167b;
                                            uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                        (long)iVar6 * 4 + lVar5),
                                                               puVar10[img_row_3._4_4_]);
                                            puVar10[iVar6] = uVar8;
                                            img_row_3._4_4_ = iVar6;
                                            goto LAB_001b287e;
                                          }
                                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b1576;
                                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar6;
                                            goto LAB_001b1f3d;
                                          }
                                          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0')
                                          goto LAB_001b172c;
                                          if (puVar9[iVar6 + lVar4] == '\0') {
                                            uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                        (long)iVar6 * 4 + lVar5),
                                                               puVar10[img_row_3._4_4_]);
                                            puVar10[iVar6] = uVar8;
                                            img_row_3._4_4_ = iVar6;
                                          }
                                          else {
LAB_001b18ea:
                                            img_row_3._4_4_ = iVar6;
                                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                                              uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                          (long)img_row_3._4_4_ * 4
                                                                          + lVar5),
                                                                 puVar10[img_row_3._4_4_ + -2]);
                                              puVar10[img_row_3._4_4_] = uVar8;
                                            }
                                            else {
                                              puVar10[img_row_3._4_4_] =
                                                   *(uint *)((long)puVar10 +
                                                            (long)img_row_3._4_4_ * 4 + lVar5);
                                            }
                                          }
                                          goto LAB_001b1bf4;
                                        }
                                        if ((int)(uVar1 - 2) < iVar6) goto LAB_001b3173;
                                        if (puVar9[iVar6] == '\0') {
                                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b3a10;
                                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                            goto LAB_001b4208;
                                          }
                                        }
                                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                        }
                                        else {
                                          if (puVar9[iVar6 + lVar4] != '\0') goto LAB_001b32c5;
                                          uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                      (long)iVar6 * 4 + lVar5),
                                                             puVar10[img_row_3._4_4_]);
                                          puVar10[iVar6] = uVar8;
                                        }
                                        goto LAB_001b4208;
                                      }
                                      puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                      goto LAB_001b13b0;
                                    }
                                    if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                                      if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                        uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                    (long)(img_row_3._4_4_ + 2) * 4
                                                                    + lVar5),
                                                           puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
                                      }
                                      else {
                                        uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar5),
                                                           *(uint *)((long)puVar10 +
                                                                    (long)(img_row_3._4_4_ + 2) * 4
                                                                    + lVar5));
                                        uVar8 = TTA::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
                                      }
                                    }
                                    else {
                                      uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                  (long)(img_row_3._4_4_ + 2) * 4 +
                                                                  lVar5),
                                                         puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    goto LAB_001b19a9;
                                  }
                                  uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                              (long)img_row_3._4_4_ * 4 + lVar5),
                                                     puVar10[img_row_3._4_4_ + -2]);
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_001b1bf4;
                                }
LAB_001b1fe7:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                                  uVar8 = TTA::NewLabel();
                                  puVar10[img_row_3._4_4_] = uVar8;
                                }
                                else {
                                  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                }
                                goto LAB_001b1f3d;
                              }
                              if ((int)(uVar1 - 2) < iVar6) {
                                if (puVar9[iVar6] == '\0') {
LAB_001b31db:
                                  img_row_3._4_4_ = iVar6;
                                  iVar6 = img_row_3._4_4_;
                                  if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
                                    puVar10[img_row_3._4_4_] = 0;
                                  }
                                  else {
LAB_001b31ee:
                                    img_row_3._4_4_ = iVar6;
                                    if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                                      uVar8 = TTA::NewLabel();
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                    }
                                  }
                                }
                                else {
                                  iVar11 = img_row_3._4_4_ + 1;
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[iVar11 + lVar3] != '\0') goto LAB_001b3082;
LAB_001b2fef:
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                                      uVar8 = TTA::NewLabel();
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      puVar10[img_row_3._4_4_] =
                                           *(uint *)((long)puVar10 +
                                                    (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
                                    }
                                  }
                                  else {
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                }
                                goto LAB_001b4208;
                              }
                              if (puVar9[iVar6] == '\0') {
LAB_001b3d91:
                                img_row_3._4_4_ = iVar6;
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[img_row_3._4_4_ + lVar3] == '\0') goto LAB_001b3603;
                                if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_001b31ee;
LAB_001b3dba:
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0')
                                goto LAB_001b358a;
LAB_001b38d8:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                                  uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                              (long)img_row_3._4_4_ * 4 + lVar5),
                                                     puVar10[img_row_3._4_4_ + -2]);
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_001b4208;
                                }
                              }
                              else {
                                iVar11 = img_row_3._4_4_ + 1;
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[iVar11 + lVar3] == '\0') {
LAB_001b367b:
                                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0')
                                  goto LAB_001b2fef;
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0')
                                    goto LAB_001b36d9;
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                  else {
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                  goto LAB_001b4208;
                                }
LAB_001b3773:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                                      uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                  (long)img_row_3._4_4_ * 4 + lVar5)
                                                         ,puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                                      uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                  (long)(img_row_3._4_4_ + -2) * 4 +
                                                                  lVar5),
                                                         *(uint *)((long)puVar10 +
                                                                  (long)img_row_3._4_4_ * 4 + lVar5)
                                                        );
                                      uVar8 = TTA::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                  (long)img_row_3._4_4_ * 4 + lVar5)
                                                         ,puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                  }
                                  else {
                                    uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                                (long)img_row_3._4_4_ * 4 + lVar5),
                                                       puVar10[img_row_3._4_4_ + -2]);
                                    puVar10[img_row_3._4_4_] = uVar8;
                                  }
                                  goto LAB_001b4208;
                                }
LAB_001b3082:
                                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0') {
                                  uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                              (long)(img_row_3._4_4_ + -2) * 4 +
                                                              lVar5),puVar10[img_row_3._4_4_ + -2]);
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_001b4208;
                                }
                              }
LAB_001b30ce:
                              if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                              }
                              else {
                                uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                            (long)img_row_3._4_4_ * 4 + lVar5),
                                                   puVar10[img_row_3._4_4_ + -2]);
                                puVar10[img_row_3._4_4_] = uVar8;
                              }
                              goto LAB_001b4208;
                            }
LAB_001b1e70:
                            img_row_3._4_4_ = iVar6;
                            iVar6 = img_row_3._4_4_;
                            if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') goto LAB_001b1cf7;
LAB_001b1e8c:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                              if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                                uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                            (long)img_row_3._4_4_ * 4 + lVar5),
                                                   puVar10[img_row_3._4_4_ + -2]);
                                puVar10[img_row_3._4_4_] = uVar8;
                              }
                              else {
                                puVar10[img_row_3._4_4_] =
                                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                              }
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          } while( true );
                        }
                      }
                      else {
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                          if (puVar9[iVar6 + lVar4] == '\0') {
                            uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                               puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                            uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                               puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else {
LAB_001b167b:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                              uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                          (long)img_row_3._4_4_ * 4 + lVar5),
                                                 puVar10[img_row_3._4_4_ + -2]);
                              puVar10[img_row_3._4_4_] = uVar8;
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          }
                          goto LAB_001b287e;
                        }
                        if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar6;
                          goto LAB_001b2b8c;
                        }
                      }
                      if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') {
                        if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
                          uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                             puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else if (puVar9[iVar6 + lVar4] == '\0') {
                          uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                             puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                          uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                             puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else {
LAB_001b1773:
                          img_row_3._4_4_ = iVar6;
                          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                            uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                        (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                                               puVar10[img_row_3._4_4_ + -2]);
                            puVar10[img_row_3._4_4_] = uVar8;
                          }
                          else {
                            puVar10[img_row_3._4_4_] =
                                 *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                          }
                        }
                        goto LAB_001b19a9;
                      }
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                    } while( true );
                  }
                  if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
                    uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                       puVar10[img_row_3._4_4_]);
                    puVar10[iVar6] = uVar8;
                    img_row_3._4_4_ = iVar6;
                  }
                  else {
                    puVar10[iVar6] =
                         *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5);
                    img_row_3._4_4_ = iVar6;
                  }
                  goto LAB_001b19a9;
                }
                uVar8 = TTA::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                goto LAB_001b13b0;
              }
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_001b1f3d;
              }
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                   puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_001b1bf4;
              }
            }
            else {
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                   puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_001b287e;
              }
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_001b2b8c;
              }
            }
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
              goto LAB_001b2039;
            }
            uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                               puVar10[img_row_3._4_4_]);
            puVar10[iVar6] = uVar8;
            img_row_3._4_4_ = iVar6;
            goto LAB_001b19a9;
          }
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001b1c35;
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] != '\0') goto LAB_001b1c35;
          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[iVar6 - lVar2] == '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                img_row_3._4_4_ = iVar6;
                goto LAB_001b2386;
              }
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_001b244d;
            }
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') {
              img_row_3._4_4_ = iVar6;
              if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001b07e3;
              goto LAB_001b0b3f;
            }
            if (puVar9[iVar6 - lVar2] != '\0') {
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_001b160f;
            }
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            img_row_3._4_4_ = iVar6;
            goto LAB_001b13b0;
          }
          img_row_3._4_4_ = iVar6;
          if (puVar9[iVar6 - lVar2] == '\0') {
LAB_001b0a60:
            if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
              uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5)
                                 ,*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5));
              puVar10[img_row_3._4_4_] = uVar8;
            }
            else {
              puVar10[img_row_3._4_4_] =
                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            }
          }
          else {
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
          }
        } while( true );
      }
      img_row_3._4_4_ = iVar6;
      if ((int)(uVar1 - 2) < 0) {
        if (*puVar9 == '\0') {
LAB_001b2fa1:
          if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
            puVar10[img_row_3._4_4_] = 0;
          }
          else {
            uVar8 = TTA::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
          }
          goto LAB_001b4208;
        }
LAB_001b2f62:
        img_row_3._4_4_ = iVar6;
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = TTA::NewLabel();
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
        }
      }
      else if (*puVar9 == '\0') {
LAB_001b35c4:
        iVar6 = img_row_3._4_4_;
        if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
LAB_001b3603:
          img_row_3._4_4_ = iVar6;
          iVar6 = img_row_3._4_4_;
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001b358a;
LAB_001b3620:
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
            puVar10[img_row_3._4_4_] = 0;
          }
          else {
            uVar8 = TTA::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
          }
        }
        else {
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001b358a;
          uVar8 = TTA::NewLabel();
          puVar10[img_row_3._4_4_] = uVar8;
        }
      }
      else {
LAB_001b358a:
        img_row_3._4_4_ = iVar6;
        iVar6 = img_row_3._4_4_;
        if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') goto LAB_001b2f62;
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
      }
LAB_001b4208:
    }
    if ((this->o_rows & 1U) != 0) {
      puVar9 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          uVar7 - 1);
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar2;
      puVar10 = cv::Mat::ptr<unsigned_int>
                          (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                            super_Mat,uVar7 - 1);
      lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      local_b4 = -2;
LAB_001b42e2:
      iVar6 = local_b4 + 2;
      if (iVar6 < (int)(uVar1 - 2)) {
        if (puVar9[iVar6] == '\0') goto LAB_001b4542;
        if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
          local_b4 = iVar6;
          goto LAB_001b555c;
        }
        iVar11 = local_b4 + 3;
        local_b4 = iVar6;
        if (puVar9[iVar11] == '\0') {
          if (puVar9[iVar6 - lVar2] == '\0') {
            uVar7 = TTA::NewLabel();
            puVar10[iVar6] = uVar7;
          }
          else {
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
          }
        }
        else {
LAB_001b4395:
          if (puVar9[(local_b4 + 2) - lVar2] != '\0') {
            iVar6 = local_b4;
            if (puVar9[local_b4 - lVar2] != '\0') goto LAB_001b43d2;
            puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
            goto LAB_001b4fdb;
          }
          if (puVar9[local_b4 - lVar2] == '\0') {
            uVar7 = TTA::NewLabel();
            puVar10[local_b4] = uVar7;
            goto LAB_001b4a1c;
          }
          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
LAB_001b4c8b:
          iVar6 = local_b4 + 2;
          if ((int)(uVar1 - 2) <= iVar6) {
            if (iVar6 <= (int)(uVar1 - 2)) {
              if (puVar9[iVar6] == '\0') {
LAB_001b5f81:
                local_b4 = iVar6;
                if (puVar9[local_b4 + 1] == '\0') {
                  puVar10[local_b4] = 0;
                  return;
                }
                if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                  puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                  return;
                }
                uVar7 = TTA::NewLabel();
                puVar10[local_b4] = uVar7;
                return;
              }
              if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                puVar10[iVar6] = puVar10[local_b4];
                return;
              }
              if (puVar9[iVar6 + lVar3] == '\0') {
                uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                   puVar10[local_b4]);
                puVar10[iVar6] = uVar7;
                return;
              }
LAB_001b606b:
              local_b4 = iVar6;
              if (puVar9[(local_b4 + -1) + lVar3] != '\0') {
                puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                return;
              }
              uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + -2) * 4 + lVar4),
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4));
              puVar10[local_b4] = uVar7;
              return;
            }
LAB_001b5bb9:
            local_b4 = iVar6;
            if (puVar9[local_b4] != '\0') {
              puVar10[local_b4] = puVar10[local_b4 + -2];
              return;
            }
            puVar10[local_b4] = 0;
            return;
          }
          if (puVar9[iVar6] == '\0') goto LAB_001b4ba9;
          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
            if (puVar9[iVar6 + lVar3] != '\0') goto LAB_001b4d16;
            uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),puVar10[local_b4])
            ;
            puVar10[iVar6] = uVar7;
            local_b4 = iVar6;
            goto LAB_001b555c;
          }
          if (puVar9[local_b4 + 3] != '\0') {
            if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[local_b4];
              local_b4 = iVar6;
              goto LAB_001b5760;
            }
            if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
              uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                 puVar10[local_b4]);
              puVar10[iVar6] = uVar7;
              local_b4 = iVar6;
              goto LAB_001b4fdb;
            }
            if (puVar9[iVar6 + lVar3] == '\0') {
              uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                 puVar10[local_b4]);
              puVar10[iVar6] = uVar7;
              local_b4 = iVar6;
              goto LAB_001b4fdb;
            }
LAB_001b4e5e:
            local_b4 = iVar6;
            if (puVar9[(local_b4 + -1) + lVar3] == '\0') {
              uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4),
                                 puVar10[local_b4 + -2]);
              puVar10[local_b4] = uVar7;
            }
            else {
              puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
            }
LAB_001b4fdb:
            do {
              iVar6 = local_b4 + 2;
              if ((int)(uVar1 - 2) <= iVar6) {
                if (iVar6 <= (int)(uVar1 - 2)) {
                  if (puVar9[iVar6] == '\0') {
                    if (puVar9[local_b4 + 3] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                      return;
                    }
                    puVar10[iVar6] = 0;
                    return;
                  }
                  if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                    return;
                  }
                  puVar10[iVar6] = puVar10[local_b4];
                  return;
                }
                goto LAB_001b5bb9;
              }
              if (puVar9[iVar6] != '\0') {
                if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                  local_b4 = iVar6;
                  goto LAB_001b555c;
                }
                if (puVar9[local_b4 + 3] == '\0') {
                  puVar10[iVar6] = puVar10[local_b4];
                  local_b4 = iVar6;
                  goto LAB_001b42e2;
                }
                if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                  puVar10[iVar6] = puVar10[local_b4];
                  local_b4 = iVar6;
LAB_001b5760:
                  do {
                    iVar6 = local_b4 + 2;
                    if ((int)(uVar1 - 2) <= iVar6) {
                      if ((int)(uVar1 - 2) < iVar6) goto LAB_001b5bb9;
                      if (puVar9[iVar6] == '\0') goto LAB_001b5f81;
                      if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        return;
                      }
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                           puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        return;
                      }
                      if (puVar9[local_b4 - lVar2] == '\0') {
                        uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                           puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        return;
                      }
                      goto LAB_001b606b;
                    }
                    if (puVar9[iVar6] == '\0') goto LAB_001b4ba9;
                    if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                      if (puVar9[local_b4 + 3] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        local_b4 = iVar6;
                        goto LAB_001b42e2;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
                          uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(local_b4 + 4) * 4 + lVar4),
                                             puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                          goto LAB_001b4fdb;
                        }
                        if (puVar9[iVar6 + lVar3] == '\0') {
                          uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(local_b4 + 4) * 4 + lVar4),
                                             puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                        }
                        else {
                          if (puVar9[local_b4 - lVar2] != '\0') goto LAB_001b4e5e;
                          uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(local_b4 + 4) * 4 + lVar4),
                                             puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                        }
                        goto LAB_001b4fdb;
                      }
                      puVar10[iVar6] = puVar10[local_b4];
                      local_b4 = iVar6;
                    }
                    else {
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                           puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                      }
                      else if (puVar9[local_b4 - lVar2] == '\0') {
                        uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                           puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                      }
                      else {
LAB_001b4d16:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + -1) + lVar3] == '\0') {
                          uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(local_b4 + -2) * 4 + lVar4),
                                             *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4));
                          puVar10[local_b4] = uVar7;
                        }
                        else {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        }
                      }
LAB_001b555c:
                      iVar6 = local_b4 + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) {
                          if (puVar9[iVar6] == '\0') {
                            puVar10[iVar6] = 0;
                            return;
                          }
                          if (puVar9[local_b4 + 1] != '\0') {
                            puVar10[iVar6] = puVar10[local_b4];
                            return;
                          }
                        }
                        else {
                          if (puVar9[iVar6] == '\0') goto LAB_001b5d57;
                          if (puVar9[local_b4 + 1] != '\0') {
LAB_001b6259:
                            local_b4 = iVar6;
                            if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                              puVar10[local_b4] = puVar10[local_b4 + -2];
                              return;
                            }
                            if (puVar9[local_b4 - lVar2] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            if (puVar9[local_b4 + lVar3] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4)
                                               ,puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                            return;
                          }
                          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                            local_b4 = iVar6;
                            if (puVar9[iVar6 - lVar2] != '\0') {
                              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                              return;
                            }
LAB_001b5e28:
                            if (puVar9[local_b4 + lVar3] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + -2) * 4 + lVar4),
                                               *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4)
                                              );
                            puVar10[local_b4] = uVar7;
                            return;
                          }
                        }
                        if (puVar9[iVar6 - lVar2] != '\0') {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                          return;
                        }
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        return;
                      }
                      if (puVar9[iVar6] == '\0') goto LAB_001b4542;
                      if (puVar9[local_b4 + 1] != '\0') {
LAB_001b52a7:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                          if (puVar9[local_b4 + 1] == '\0') {
                            puVar10[local_b4] = puVar10[local_b4 + -2];
                            goto LAB_001b42e2;
                          }
                          if (puVar9[(local_b4 + 2) - lVar2] == '\0') {
                            puVar10[local_b4] = puVar10[local_b4 + -2];
                            goto LAB_001b5760;
                          }
                          if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                            uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + 2) * 4 + lVar4),
                                               puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                          }
                          else if (puVar9[local_b4 - lVar2] == '\0') {
                            if (puVar9[local_b4 + lVar3] == '\0') {
                              uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                          (long)(local_b4 + 2) * 4 + lVar4),
                                                 puVar10[local_b4 + -2]);
                              puVar10[local_b4] = uVar7;
                            }
                            else {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                            }
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                          }
                          goto LAB_001b4fdb;
                        }
                        if (puVar9[local_b4 - lVar2] == '\0') {
                          if (puVar9[local_b4 + lVar3] == '\0') {
                            uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4)
                                               ,puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                        }
                        else {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        }
                        goto LAB_001b555c;
                      }
                      if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                        local_b4 = iVar6;
                        if (puVar9[iVar6 - lVar2] == '\0') {
LAB_001b4689:
                          if (puVar9[local_b4 + lVar3] == '\0') {
                            uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + -2) * 4 + lVar4),
                                               *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4)
                                              );
                            puVar10[local_b4] = uVar7;
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                        }
                        else {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                        }
                        goto LAB_001b555c;
                      }
                      if (puVar9[local_b4 + 3] == '\0') {
                        if (puVar9[iVar6 - lVar2] == '\0') {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          local_b4 = iVar6;
                        }
                        else {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                          local_b4 = iVar6;
                        }
                        goto LAB_001b42e2;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001b43d2;
LAB_001b47b0:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                          uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(local_b4 + -2) * 4 + lVar4),
                                             *(uint *)((long)puVar10 +
                                                      (long)(local_b4 + 2) * 4 + lVar4));
                          puVar10[local_b4] = uVar7;
                        }
                        else if (puVar9[local_b4 + lVar3] == '\0') {
                          uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                      (long)(local_b4 + -2) * 4 + lVar4),
                                             *(uint *)((long)puVar10 +
                                                      (long)(local_b4 + 2) * 4 + lVar4));
                          puVar10[local_b4] = uVar7;
                        }
                        else {
                          puVar10[local_b4] =
                               *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                        }
                        goto LAB_001b4fdb;
                      }
                      if (puVar9[iVar6 - lVar2] != '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                        local_b4 = iVar6;
                        goto LAB_001b4c8b;
                      }
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                      local_b4 = iVar6;
LAB_001b4a1c:
                      iVar6 = local_b4 + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) goto LAB_001b5bb9;
                        if (puVar9[iVar6] != '\0') {
                          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                            uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                               puVar10[local_b4]);
                            puVar10[iVar6] = uVar7;
                            return;
                          }
                          puVar10[iVar6] = puVar10[local_b4];
                          return;
                        }
                        goto LAB_001b5f81;
                      }
                      if (puVar9[iVar6] == '\0') {
LAB_001b4ba9:
                        local_b4 = iVar6;
                        if (puVar9[local_b4 + 1] == '\0') {
                          puVar10[local_b4] = 0;
                          goto LAB_001b45bb;
                        }
                        if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
LAB_001b5257:
                          while (iVar6 = local_b4 + 2, iVar6 < (int)(uVar1 - 2)) {
                            if (puVar9[iVar6] != '\0') goto LAB_001b52a7;
LAB_001b4542:
                            while (local_b4 = iVar6, puVar9[local_b4 + 1] == '\0') {
                              puVar10[local_b4] = 0;
LAB_001b45bb:
                              iVar6 = local_b4 + 2;
                              if ((int)(uVar1 - 2) <= iVar6) {
                                if ((int)(uVar1 - 2) < iVar6) {
                                  if (puVar9[iVar6] == '\0') {
                                    puVar10[iVar6] = 0;
                                    return;
                                  }
                                }
                                else {
                                  if (puVar9[iVar6] == '\0') goto LAB_001b5d57;
                                  if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                                    if (puVar9[iVar6 - lVar2] != '\0') {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                      return;
                                    }
                                    iVar11 = local_b4 + 1;
                                    local_b4 = iVar6;
                                    if (puVar9[iVar11 - lVar2] == '\0') {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                      return;
                                    }
                                    goto LAB_001b5e28;
                                  }
                                }
                                if (puVar9[iVar6 - lVar2] != '\0') {
                                  puVar10[iVar6] =
                                       *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                  return;
                                }
                                if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                                  puVar10[iVar6] =
                                       *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                  return;
                                }
                                uVar7 = TTA::NewLabel();
                                puVar10[iVar6] = uVar7;
                                return;
                              }
                              if (puVar9[iVar6] != '\0') {
                                if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                                  if (puVar9[iVar6 - lVar2] == '\0') {
                                    iVar11 = local_b4 + 1;
                                    local_b4 = iVar6;
                                    if (puVar9[iVar11 - lVar2] != '\0') goto LAB_001b4689;
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_001b555c;
                                }
                                if (puVar9[local_b4 + 3] == '\0') {
                                  if (puVar9[iVar6 - lVar2] == '\0') {
                                    if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                                      uVar7 = TTA::NewLabel();
                                      puVar10[iVar6] = uVar7;
                                      local_b4 = iVar6;
                                    }
                                    else {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                      local_b4 = iVar6;
                                    }
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_001b42e2;
                                }
                                if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                                  if (puVar9[iVar6 - lVar2] != '\0') {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                    goto LAB_001b4c8b;
                                  }
                                  if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                                    uVar7 = TTA::NewLabel();
                                    puVar10[iVar6] = uVar7;
                                    local_b4 = iVar6;
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_001b4a1c;
                                }
                                if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001b43d2;
                                if (puVar9[(local_b4 + 1) - lVar2] != '\0') goto LAB_001b47b0;
                                puVar10[iVar6] =
                                     *(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4);
                                local_b4 = iVar6;
                                goto LAB_001b4fdb;
                              }
                            }
                            if (puVar9[(local_b4 + 1) - lVar2] == '\0') goto LAB_001b4395;
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                          if ((int)(uVar1 - 2) < iVar6) goto LAB_001b5bb9;
                          if (puVar9[iVar6] == '\0') goto LAB_001b5d57;
                          goto LAB_001b6259;
                        }
                        if (puVar9[(local_b4 + 2) - lVar2] != '\0') {
                          puVar10[local_b4] =
                               *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                          goto LAB_001b4fdb;
                        }
                        uVar7 = TTA::NewLabel();
                        puVar10[local_b4] = uVar7;
                        goto LAB_001b4a1c;
                      }
                      if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                        uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                           puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                        goto LAB_001b555c;
                      }
                      if (puVar9[local_b4 + 3] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        local_b4 = iVar6;
                        goto LAB_001b42e2;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        uVar7 = TTA::Merge(*(uint *)((long)puVar10 +
                                                    (long)(local_b4 + 4) * 4 + lVar4),
                                           puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                        goto LAB_001b4fdb;
                      }
                      puVar10[iVar6] = puVar10[local_b4];
                      local_b4 = iVar6;
                    }
                  } while( true );
                }
                if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
                  uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                     puVar10[local_b4]);
                  puVar10[iVar6] = uVar7;
                  local_b4 = iVar6;
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4);
                  local_b4 = iVar6;
                }
                goto LAB_001b4fdb;
              }
              if (puVar9[local_b4 + 3] == '\0') {
                puVar10[iVar6] = 0;
                local_b4 = iVar6;
                goto LAB_001b45bb;
              }
              if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                local_b4 = iVar6;
                goto LAB_001b5257;
              }
              if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                local_b4 = iVar6;
                goto LAB_001b4c8b;
              }
LAB_001b43d2:
              local_b4 = iVar6;
              if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                uVar7 = TTA::Merge(*(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4),
                                   *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4));
                puVar10[local_b4] = uVar7;
              }
              else {
                puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
              }
            } while( true );
          }
          puVar10[iVar6] = puVar10[local_b4];
          local_b4 = iVar6;
        }
        goto LAB_001b42e2;
      }
      if ((int)(uVar1 - 2) < iVar6) {
        local_b4 = iVar6;
        if (puVar9[iVar6] == '\0') {
          puVar10[iVar6] = 0;
          return;
        }
      }
      else {
        local_b4 = iVar6;
        if (puVar9[iVar6] == '\0') {
LAB_001b5d57:
          local_b4 = iVar6;
          if (puVar9[local_b4 + 1] == '\0') {
            puVar10[local_b4] = 0;
            return;
          }
        }
        if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
          return;
        }
      }
      if (puVar9[local_b4 - lVar2] == '\0') {
        uVar7 = TTA::NewLabel();
        puVar10[local_b4] = uVar7;
      }
      else {
        puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
      }
    }
  }
  return;
LAB_001b1c35:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
LAB_001b1c51:
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
      }
    }
    else {
      puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
    }
    goto LAB_001b287e;
  }
  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
    puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
    goto LAB_001b2b8c;
  }
LAB_001b1cf7:
  iVar6 = img_row_3._4_4_;
  if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') goto LAB_001b1d13;
  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
  goto LAB_001b2039;
LAB_001b1710:
  if (puVar9[img_row_3._4_4_ + 3] == '\0') {
    puVar10[iVar6] = puVar10[img_row_3._4_4_];
    img_row_3._4_4_ = iVar6;
LAB_001b2b8c:
    iVar6 = img_row_3._4_4_ + 2;
    if ((int)(uVar1 - 2) <= iVar6) {
      if ((int)(uVar1 - 2) < iVar6) {
        if (puVar9[iVar6] == '\0') goto LAB_001b31db;
        if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b2f62;
      }
      else {
        if (puVar9[iVar6] == '\0') {
          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b3603;
          if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001b31ee;
        }
        if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b358a;
        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
          if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
            uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                               puVar10[img_row_3._4_4_]);
            puVar10[iVar6] = uVar8;
          }
          else {
LAB_001b3f24:
            img_row_3._4_4_ = iVar6;
            iVar6 = img_row_3._4_4_;
            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_001b3c69;
            uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                               puVar10[img_row_3._4_4_ + -2]);
            puVar10[img_row_3._4_4_] = uVar8;
          }
          goto LAB_001b4208;
        }
      }
      if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001b34ff;
      puVar10[iVar6] = puVar10[img_row_3._4_4_];
      goto LAB_001b4208;
    }
    if (puVar9[iVar6] == '\0') {
      if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b096b;
      if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001b1fe7;
      if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b091c;
      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                             puVar10[img_row_3._4_4_]);
          puVar10[iVar6] = uVar8;
          img_row_3._4_4_ = iVar6;
        }
        else {
LAB_001b281d:
          img_row_3._4_4_ = iVar6;
          iVar6 = img_row_3._4_4_;
          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_001b1e8c;
          uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        goto LAB_001b1bf4;
      }
    }
    else {
      if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b0769;
      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                             puVar10[img_row_3._4_4_]);
          puVar10[iVar6] = uVar8;
          img_row_3._4_4_ = iVar6;
        }
        else {
LAB_001b24be:
          img_row_3._4_4_ = iVar6;
          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_001b1c51;
          uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        goto LAB_001b287e;
      }
      if (puVar9[img_row_3._4_4_ + 3] == '\0') {
        if (puVar9[iVar6 - lVar2] == '\0') {
          puVar10[iVar6] = puVar10[img_row_3._4_4_];
          img_row_3._4_4_ = iVar6;
          goto LAB_001b2386;
        }
        if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_001b2738;
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                           puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
LAB_001b244d:
        while (iVar6 = img_row_3._4_4_ + 2, iVar6 < (int)(uVar1 - 2)) {
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] != '\0') {
              if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001b1fe7;
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b091c;
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') goto LAB_001b2527;
              goto LAB_001b281d;
            }
LAB_001b096b:
            while( true ) {
              while( true ) {
                img_row_3._4_4_ = iVar6;
                iVar6 = img_row_3._4_4_;
                if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001b091c;
LAB_001b0985:
                img_row_3._4_4_ = iVar6;
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') break;
                uVar8 = TTA::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                iVar6 = img_row_3._4_4_ + 2;
                if ((int)(uVar1 - 2) <= iVar6) {
                  if ((int)(uVar1 - 2) < iVar6) {
                    img_row_3._4_4_ = iVar6;
                    if (puVar9[iVar6] == '\0') goto LAB_001b312f;
                    goto LAB_001b3082;
                  }
                  if (puVar9[iVar6] != '\0') goto LAB_001b3773;
                  if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b3603;
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_001b38d8;
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  goto LAB_001b4208;
                }
                if (puVar9[iVar6] != '\0') goto LAB_001b0d4c;
                if (puVar9[iVar6 + lVar3] != '\0') {
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_001b1244;
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar6;
                  goto LAB_001b1f3d;
                }
              }
              puVar10[img_row_3._4_4_] = 0;
              img_row_3._4_4_ = img_row_3._4_4_ + 2;
              if ((int)(uVar1 - 2) <= img_row_3._4_4_) {
                if ((int)(uVar1 - 2) < img_row_3._4_4_) {
                  if (puVar9[img_row_3._4_4_] == '\0') goto LAB_001b2fa1;
                  goto LAB_001b2fef;
                }
                if (puVar9[img_row_3._4_4_] == '\0') goto LAB_001b35c4;
                goto LAB_001b367b;
              }
              if (puVar9[img_row_3._4_4_] != '\0') break;
LAB_001b08f3:
              iVar6 = img_row_3._4_4_;
              if (puVar9[img_row_3._4_4_ + lVar3] != '\0') {
                if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_001b091c;
                uVar8 = TTA::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                goto LAB_001b1f3d;
              }
            }
LAB_001b0a02:
            if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
              if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0') goto LAB_001b0a60;
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
              goto LAB_001b287e;
            }
            if (puVar9[img_row_3._4_4_ + 1] != '\0') {
              if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
                if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_001b07e3;
                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                }
                else {
LAB_001b0b3f:
                  if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                    uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                       *(uint *)((long)puVar10 +
                                                (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                    uVar8 = TTA::Merge(*(uint *)((long)puVar10 +
                                                (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                       *(uint *)((long)puVar10 +
                                                (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                  }
                }
                goto LAB_001b19a9;
              }
              if (puVar9[img_row_3._4_4_ - lVar2] != '\0') {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                goto LAB_001b160f;
              }
              if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                uVar8 = TTA::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
              }
              goto LAB_001b13b0;
            }
            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
              if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                uVar8 = TTA::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
              }
              goto LAB_001b2386;
            }
            puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
          }
          else {
            if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b0769;
            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_001b24be;
            if (puVar9[img_row_3._4_4_ + 3] != '\0') {
LAB_001b2527:
              if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
                if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001b26a2;
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_001b13b0;
              }
              if (puVar9[(img_row_3._4_4_ + 3) + lVar4] != '\0') goto LAB_001b2559;
              if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001b25c2;
              uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                 puVar10[img_row_3._4_4_]);
              puVar10[iVar6] = uVar8;
              img_row_3._4_4_ = iVar6;
              goto LAB_001b19a9;
            }
            if (puVar9[iVar6 - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
LAB_001b2386:
              while( true ) {
                iVar6 = img_row_3._4_4_ + 2;
                if ((int)(uVar1 - 2) <= iVar6) {
                  if (iVar6 <= (int)(uVar1 - 2)) {
                    img_row_3._4_4_ = iVar6;
                    if (puVar9[iVar6] == '\0') goto LAB_001b3d91;
                    goto LAB_001b3dba;
                  }
                  if (puVar9[iVar6] == '\0') goto LAB_001b31db;
                  iVar11 = img_row_3._4_4_ + 1;
                  img_row_3._4_4_ = iVar6;
                  if (puVar9[iVar11 + lVar3] == '\0') goto LAB_001b2f62;
                  goto LAB_001b30ce;
                }
                if (puVar9[iVar6] == '\0') goto LAB_001b1f9a;
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b0769;
                if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                  uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                     puVar10[img_row_3._4_4_]);
                  puVar10[iVar6] = uVar8;
                  img_row_3._4_4_ = iVar6;
                  goto LAB_001b287e;
                }
                iVar11 = img_row_3._4_4_ + 3;
                img_row_3._4_4_ = iVar6;
                if (puVar9[iVar11] != '\0') goto LAB_001b128e;
LAB_001b11b0:
                if (puVar9[img_row_3._4_4_ - lVar2] != '\0') break;
                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
              }
              uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                 puVar10[img_row_3._4_4_ + -2]);
              puVar10[img_row_3._4_4_] = uVar8;
            }
            else {
LAB_001b2738:
              img_row_3._4_4_ = iVar6;
              if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                   puVar10[img_row_3._4_4_ + -2]);
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
            }
          }
        }
        if ((int)(uVar1 - 2) < iVar6) {
          if (puVar9[iVar6] == '\0') goto LAB_001b31db;
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b2f62;
        }
        else {
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_001b3603;
            if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001b31ee;
          }
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_001b358a;
          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_001b3f24;
        }
        if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001b32c5;
        puVar10[iVar6] = puVar10[img_row_3._4_4_];
        goto LAB_001b4208;
      }
    }
    if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
      if (puVar9[iVar6 - lVar2] == '\0') {
        puVar10[iVar6] = puVar10[img_row_3._4_4_];
        img_row_3._4_4_ = iVar6;
        goto LAB_001b13b0;
      }
      if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                           puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else {
LAB_001b26a2:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
          uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
        }
      }
      goto LAB_001b160f;
    }
    if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
      if (puVar9[iVar6 - lVar2] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                           puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                           *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5));
        uVar8 = TTA::Merge(uVar8,puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else {
LAB_001b25c2:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
          uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
          uVar8 = TTA::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
      }
    }
    else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                         puVar10[img_row_3._4_4_]);
      puVar10[iVar6] = uVar8;
      img_row_3._4_4_ = iVar6;
    }
    else {
LAB_001b2559:
      img_row_3._4_4_ = iVar6;
      if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_001b1d2f;
      uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                         puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_001b19a9;
  }
LAB_001b172c:
  if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
    puVar10[iVar6] = puVar10[img_row_3._4_4_];
    img_row_3._4_4_ = iVar6;
    goto LAB_001b2039;
  }
  if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
    uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                       puVar10[img_row_3._4_4_]);
    puVar10[iVar6] = uVar8;
    img_row_3._4_4_ = iVar6;
  }
  else {
    if (puVar9[iVar6 + lVar4] != '\0') goto LAB_001b1773;
    uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                       puVar10[img_row_3._4_4_]);
    puVar10[iVar6] = uVar8;
    img_row_3._4_4_ = iVar6;
  }
  goto LAB_001b19a9;
LAB_001b091c:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
    puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
    goto LAB_001b1bf4;
  }
LAB_001b07b6:
  if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
    if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_001b07e3;
    puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
    goto LAB_001b19a9;
  }
  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
    uVar8 = TTA::NewLabel();
    puVar10[img_row_3._4_4_] = uVar8;
    goto LAB_001b13b0;
  }
  puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
  goto LAB_001b160f;
LAB_001b0d4c:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                           *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5));
        uVar8 = TTA::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
    }
    else {
      uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                         puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_001b287e;
  }
  if (puVar9[img_row_3._4_4_ + 1] != '\0') {
    if (puVar9[(img_row_3._4_4_ + 2) - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') goto LAB_001b10fe;
      uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                         puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
      goto LAB_001b2039;
    }
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                           *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
        uVar8 = TTA::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                           *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
        uVar8 = TTA::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
    }
    else if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
      uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                         *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
      uVar8 = TTA::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    else {
      uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                         puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_001b19a9;
  }
  if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') goto LAB_001b11b0;
  uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                     puVar10[img_row_3._4_4_ + -2]);
  puVar10[img_row_3._4_4_] = uVar8;
  goto LAB_001b2b8c;
LAB_001b1d13:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
    uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                       puVar10[img_row_3._4_4_ + -2]);
    puVar10[img_row_3._4_4_] = uVar8;
  }
  else {
LAB_001b1d2f:
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = TTA::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        puVar10[img_row_3._4_4_] =
             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
      }
    }
    else {
      puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
    }
  }
  goto LAB_001b19a9;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}